

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetImageData>::reset
          (QSharedDataPointer<QStyleSheetImageData> *this,QStyleSheetImageData *ptr)

{
  bool bVar1;
  QStyleSheetImageData *pQVar2;
  QStyleSheetImageData *in_RSI;
  totally_ordered_wrapper<QStyleSheetImageData_*> *in_RDI;
  long in_FS_OFFSET;
  QStyleSheetImageData *old;
  totally_ordered_wrapper<QStyleSheetImageData_*> *in_stack_ffffffffffffffb8;
  totally_ordered_wrapper<QStyleSheetImageData_*> local_18;
  totally_ordered_wrapper<QStyleSheetImageData_*> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::get(in_RDI);
  if (in_RSI != pQVar2) {
    if (in_RSI != (QStyleSheetImageData *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x45428c);
    }
    Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::totally_ordered_wrapper(&local_18,in_RSI);
    local_10 = std::
               exchange<Qt::totally_ordered_wrapper<QStyleSheetImageData*>,Qt::totally_ordered_wrapper<QStyleSheetImageData*>>
                         (in_stack_ffffffffffffffb8,
                          (totally_ordered_wrapper<QStyleSheetImageData_*> *)0x4542aa);
    pQVar2 = Qt::totally_ordered_wrapper<QStyleSheetImageData_*>::get(&local_10);
    if (((pQVar2 != (QStyleSheetImageData *)0x0) &&
        (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x4542d0), !bVar1)) &&
       (pQVar2 != (QStyleSheetImageData *)0x0)) {
      QStyleSheetImageData::~QStyleSheetImageData((QStyleSheetImageData *)0x4542ec);
      operator_delete(pQVar2,0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }